

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase988::run(TestCase988 *this)

{
  StructDataBitCount *this_00;
  int local_208;
  bool local_202;
  byte local_201;
  bool _kj_shouldLog;
  byte *pbStack_200;
  byte b;
  byte *__end2;
  byte *__begin2;
  byte (*__range2) [50];
  size_t sStack_1e0;
  ArrayPtr<const_unsigned_char> local_1d0;
  Builder local_1c0;
  ArrayPtr<const_unsigned_char> local_1b0;
  Orphanage local_1a0;
  Orphan<capnp::Data> local_190;
  undefined1 local_160 [8];
  Builder root;
  MallocMessageBuilder builder;
  word align;
  byte abStack_16 [6];
  TestCase988 *local_10;
  TestCase988 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)0x5555555555555555;
  this_00 = &root._builder.dataSize;
  local_10 = this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_160,(MessageBuilder *)this_00);
  local_1a0 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Data::Builder::Builder(&local_1c0,(byte *)&builder.moreSegments.builder.disposer,0x32);
  local_1b0 = (ArrayPtr<const_unsigned_char>)Data::Builder::operator_cast_to_Reader(&local_1c0);
  Orphanage::referenceExternalData(&local_190,&local_1a0,(Reader)local_1b0);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField
            ((Builder *)local_160,&local_190);
  Orphan<capnp::Data>::~Orphan(&local_190);
  __range2 = (byte (*) [50])0x0;
  sStack_1e0 = 0;
  Data::Builder::Builder((Builder *)&__range2);
  local_1d0 = (ArrayPtr<const_unsigned_char>)
              Data::Builder::operator_cast_to_Reader((Builder *)&__range2);
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField
            ((Builder *)local_160,(Reader)local_1d0);
  pbStack_200 = abStack_16;
  __end2 = (byte *)&builder.moreSegments.builder.disposer;
  __begin2 = __end2;
  for (; __end2 != pbStack_200; __end2 = __end2 + 1) {
    local_201 = *__end2;
    if (local_201 != 'U') {
      local_202 = kj::_::Debug::shouldLog(ERROR);
      while (local_202 != false) {
        local_208 = 0x55;
        kj::_::Debug::log<char_const(&)[31],int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x3ee,ERROR,"\"failed: expected \" \"(0x55) == (b)\", 0x55, b",
                   (char (*) [31])"failed: expected (0x55) == (b)",&local_208,&local_201);
        local_202 = false;
      }
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, ReferenceExternalData_NoZeroOnSet) {
  // Verify that an external blob is not zeroed by setFoo().

  union {
    word align;
    byte data[50];
  };

  memset(data, 0x55, sizeof(data));

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  root.adoptDataField(builder.getOrphanage().referenceExternalData(
      Data::Builder(data, sizeof(data))));

  root.setDataField(Data::Builder());

  for (byte b: data) {
    EXPECT_EQ(0x55, b);
  }
}